

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
MPLSParser::composePlayItem
          (MPLSParser *this,BitStreamWriter *writer,size_t playItemNum,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint8_t *puVar6;
  char *dest;
  const_reference pvVar7;
  pointer ppVar8;
  size_type sVar9;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_> local_a8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_> local_a0;
  uint local_98;
  char local_94 [4];
  int connection_condition;
  char clip_codec_identifier [5];
  int local_7c;
  string local_78;
  undefined1 local_58 [8];
  string clip_Information_file_name;
  int fileNum;
  int beforeCount;
  uint16_t *lengthPos;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  *pmtIndexList_local;
  size_t playItemNum_local;
  BitStreamWriter *writer_local;
  MPLSParser *this_local;
  
  puVar6 = BitStream::getBuffer(&writer->super_BitStream);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,0x10,0);
  iVar4 = BitStreamWriter::getBitsCount(writer);
  clip_Information_file_name.field_2._12_4_ = iVar4 / 8;
  clip_Information_file_name.field_2._8_4_ = (undefined4)playItemNum;
  if ((this->isDependStreamExist & 1U) != 0) {
    clip_Information_file_name.field_2._8_4_ = clip_Information_file_name.field_2._8_4_ << 1;
  }
  local_7c = clip_Information_file_name.field_2._8_4_ + this->m_m2tsOffset;
  int32ToStr_abi_cxx11_(&local_78,&local_7c);
  strPadLeft((string *)local_58,&local_78,5,'0');
  std::__cxx11::string::~string((string *)&local_78);
  dest = (char *)std::__cxx11::string::c_str();
  CLPIStreamInfo::writeString(dest,writer,5);
  connection_condition._0_1_ = 0;
  builtin_strncpy(local_94,"M2TS",4);
  CLPIStreamInfo::writeString(local_94,writer,4);
  BitStreamWriter::putBits(writer,0xb,0);
  BitStreamWriter::putBit(writer,0);
  local_98 = (uint)(playItemNum != 0) * 5 + 1;
  BitStreamWriter::putBits(writer,4,local_98);
  BitStreamWriter::putBits(writer,8,(uint)this->ref_to_STC_id);
  if (playItemNum == 0) {
LAB_0036572c:
    BitStreamWriter::putBits(writer,0x20,this->IN_time);
  }
  else {
    pvVar7 = std::
             vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ::operator[](pmtIndexList,playItemNum - 1);
    bVar1 = std::
            map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
            ::empty(pvVar7);
    if (bVar1) goto LAB_0036572c;
    pvVar7 = std::
             vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ::operator[](pmtIndexList,playItemNum);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
         ::begin(pvVar7);
    ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>::operator->
                       (&local_a0);
    BitStreamWriter::putBits(writer,0x20,(uint)ppVar8->first >> 1);
  }
  sVar9 = std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::size(pmtIndexList);
  if (playItemNum != sVar9 - 1) {
    pvVar7 = std::
             vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             ::operator[](pmtIndexList,playItemNum + 1);
    bVar1 = std::
            map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
            ::empty(pvVar7);
    if (!bVar1) {
      pvVar7 = std::
               vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
               ::operator[](pmtIndexList,playItemNum + 1);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
           ::begin(pvVar7);
      ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>::
               operator->(&local_a8);
      BitStreamWriter::putBits(writer,0x20,(uint)(ppVar8->first >> 1));
      goto LAB_003657fb;
    }
  }
  BitStreamWriter::putBits(writer,0x20,this->OUT_time);
LAB_003657fb:
  BitStreamWriter::putBits(writer,0x1c,0);
  bVar1 = isV3();
  uVar5 = 0;
  if (bVar1) {
    uVar5 = 0xf;
  }
  BitStreamWriter::putBits(writer,4,uVar5);
  BitStreamWriter::putBit(writer,0);
  bVar1 = isV3();
  BitStreamWriter::putBit(writer,(uint)bVar1);
  BitStreamWriter::putBits(writer,0x1e,0);
  BitStreamWriter::putBit(writer,this->PlayItem_random_access_flag & 1);
  BitStreamWriter::putBits(writer,7,0);
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,0x10,0);
  composeSTN_table(this,writer,playItemNum,false);
  uVar5 = BitStreamWriter::getBitsCount(writer);
  if ((int)uVar5 < 0) {
    uVar5 = uVar5 + 7;
  }
  uVar2 = my_ntohs((short)(uVar5 >> 3) - (short)clip_Information_file_name.field_2._12_4_);
  *(uint16_t *)(puVar6 + iVar3 / 8) = uVar2;
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void MPLSParser::composePlayItem(BitStreamWriter& writer, const size_t playItemNum,
                                 const std::vector<PMTIndex>& pmtIndexList)
{
    const auto lengthPos = reinterpret_cast<uint16_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(16, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    int fileNum = static_cast<int>(playItemNum);
    if (isDependStreamExist)
        fileNum *= 2;
    const std::string clip_Information_file_name = strPadLeft(int32ToStr(fileNum + m_m2tsOffset), 5u, '0');
    CLPIStreamInfo::writeString(clip_Information_file_name.c_str(), writer, 5);
    constexpr char clip_codec_identifier[] = "M2TS";
    CLPIStreamInfo::writeString(clip_codec_identifier, writer, 4);
    writer.putBits(11, 0);  // reserved_for_future_use
    writer.putBit(0);       // is_multi_angle
    const int connection_condition = playItemNum == 0 ? 1 : 6;
    writer.putBits(4, connection_condition);
    writer.putBits(8, ref_to_STC_id);

    if (playItemNum != 0 && !pmtIndexList[playItemNum - 1].empty())
        writer.putBits(32, static_cast<unsigned>(pmtIndexList[playItemNum].begin()->first) / 2);
    else
        writer.putBits(32, IN_time);

    if (playItemNum != pmtIndexList.size() - 1 && !pmtIndexList[playItemNum + 1].empty())
        writer.putBits(32, static_cast<unsigned>(pmtIndexList[playItemNum + 1].begin()->first / 2));
    else
        writer.putBits(32, OUT_time);

    writer.putBits(28, 0);               // UO_mask_table;
    writer.putBits(4, isV3() ? 15 : 0);  // UO_mask_table;
    writer.putBit(0);                    // reserved
    writer.putBit(isV3() ? 1 : 0);       // UO_mask_table: SecondaryPGStreamNumberChange
    writer.putBits(30, 0);               // UO_mask_table cont;

    writer.putBit(PlayItem_random_access_flag);
    writer.putBits(7, 0);   // reserved_for_future_use
    writer.putBits(8, 0);   // still_mode
    writer.putBits(16, 0);  // reserved after stillMode != 0x01
    composeSTN_table(writer, playItemNum, false);
    *lengthPos = my_htons(static_cast<uint16_t>(writer.getBitsCount() / 8 - beforeCount));
}